

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall Am_Object::Text_Inspect(Am_Object *this,Am_Slot_Key key)

{
  ostream *poVar1;
  Am_Slot_Data *slot;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\nFor Object ");
  Print(this,poVar1);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::operator<<(poVar1,")\n");
  if (this->data == (Am_Object_Data *)0x0) {
    std::operator<<((ostream *)&std::cout,"  ** Object is not Valid\n");
  }
  else {
    slot = Am_Object_Data::find_slot(this->data,key);
    std::operator<<((ostream *)&std::cout,"  Slot ");
    Am_Object_Data::print_slot_name_and_value(this->data,key,slot);
  }
  std::ostream::flush();
  return;
}

Assistant:

void
Am_Object::Text_Inspect(Am_Slot_Key key) const
{
  std::cout << "\nFor Object " << *this << " (" << (void *)data << ")\n";
  if (data) {
    Am_Slot_Data *slot = data->find_slot(key);
    std::cout << "  Slot ";
    data->print_slot_name_and_value(key, slot);
  } else
    std::cout << "  ** Object is not Valid\n";
  std::cout << std::flush;
}